

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_columnref_expression.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::ExpressionBinder::QualifyColumnNameWithManyDotsInternal
          (ExpressionBinder *this,ColumnRefExpression *col_ref,ErrorData *error,
          idx_t *struct_extract_start)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  Binder *pBVar1;
  Binder *pBVar2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference column_name;
  ErrorData *error_00;
  BindingAlias *table_alias;
  size_type __n;
  undefined8 *in_R8;
  string *column_name_00;
  optional_ptr<duckdb::Binding,_true> binding;
  ErrorData col_error;
  optional_ptr<duckdb::Binding,_true> local_e0;
  undefined8 *local_d8;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_d0;
  Binder *local_c8;
  undefined1 local_c0 [16];
  undefined1 local_b0 [128];
  
  local_e0.ptr = (Binding *)0x0;
  this_00 = &(error->final_message).field_2;
  local_d8 = in_R8;
  local_d0._M_head_impl = (ParsedExpression *)this;
  local_c0._8_8_ = error;
  if (0x60 < *(long *)((long)&(error->final_message).field_2 + 8) -
             (error->final_message).field_2._M_allocated_capacity) {
    local_c8 = (Binder *)
               (col_ref->column_names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           *)this_00,0);
    pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           *)this_00,1);
    pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           *)this_00,2);
    column_name = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                *)this_00,3);
    local_e0 = Binder::GetMatchingBinding
                         (local_c8,pvVar4,pvVar5,pvVar6,column_name,
                          (ErrorData *)struct_extract_start);
    if (local_e0.ptr != (Binding *)0x0) {
      *local_d8 = 4;
      table_alias = (BindingAlias *)
                    &(col_ref->column_names).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[4]._M_string_length;
      optional_ptr<duckdb::Binding,_true>::CheckValid(&local_e0);
      column_name_00 = &((local_e0.ptr)->alias).catalog;
      __n = 3;
      goto LAB_0119eb5d;
    }
  }
  pBVar1 = (Binder *)
           (col_ref->column_names).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c8 = (Binder *)col_ref;
  pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         *)this_00,0);
  local_b0._0_8_ = local_b0 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,anon_var_dwarf_6372561 + 9);
  pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         *)this_00,1);
  pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         *)this_00,2);
  local_e0 = Binder::GetMatchingBinding
                       (pBVar1,pvVar4,(string *)local_b0,pvVar5,pvVar6,
                        (ErrorData *)struct_extract_start);
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_);
  }
  pBVar1 = local_c8;
  if (local_e0.ptr == (Binding *)0x0) {
    pBVar2 = *(Binder **)&(local_c8->CTE_bindings)._M_h._M_rehash_policy;
    pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           *)this_00,0);
    pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           *)this_00,1);
    pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           *)this_00,2);
    local_e0 = Binder::GetMatchingBinding
                         (pBVar2,pvVar4,pvVar5,pvVar6,(ErrorData *)struct_extract_start);
    if (local_e0.ptr == (Binding *)0x0) {
      pBVar2 = *(Binder **)&(pBVar1->CTE_bindings)._M_h._M_rehash_policy;
      pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)this_00,0);
      pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)this_00,1);
      local_e0 = Binder::GetMatchingBinding(pBVar2,pvVar4,pvVar5,(ErrorData *)struct_extract_start);
      if (local_e0.ptr == (Binding *)0x0) {
        ErrorData::ErrorData((ErrorData *)local_b0);
        error_00 = (ErrorData *)
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 *)this_00,0);
        QualifyColumnName((ExpressionBinder *)local_c0,(string *)pBVar1,error_00);
        _Var3._M_head_impl = local_d0._M_head_impl;
        if ((_func_int **)local_c0._0_8_ == (_func_int **)0x0) {
          CreateStructPack((ExpressionBinder *)local_d0._M_head_impl,(ColumnRefExpression *)pBVar1);
          if ((_func_int **)local_c0._0_8_ != (_func_int **)0x0) {
            (**(code **)(*(_func_int **)local_c0._0_8_ + 8))();
          }
        }
        else {
          *local_d8 = 1;
          ((local_d0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression =
               (_func_int **)local_c0._0_8_;
        }
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)(local_b0 + 0x48));
        if ((undefined1 *)local_b0._40_8_ != local_b0 + 0x38) {
          operator_delete((void *)local_b0._40_8_);
        }
        if ((undefined1 *)local_b0._8_8_ == local_b0 + 0x18) {
          return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                  )(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                    )_Var3._M_head_impl;
        }
        operator_delete((void *)local_b0._8_8_);
        return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               )(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )_Var3._M_head_impl;
      }
      *local_d8 = 2;
      table_alias = (BindingAlias *)(*(long *)&(pBVar1->CTE_bindings)._M_h._M_rehash_policy + 0x88);
      optional_ptr<duckdb::Binding,_true>::CheckValid(&local_e0);
      column_name_00 = &((local_e0.ptr)->alias).catalog;
      __n = 1;
      goto LAB_0119eb5d;
    }
  }
  *local_d8 = 3;
  table_alias = (BindingAlias *)(*(long *)&(pBVar1->CTE_bindings)._M_h._M_rehash_policy + 0x88);
  optional_ptr<duckdb::Binding,_true>::CheckValid(&local_e0);
  column_name_00 = &((local_e0.ptr)->alias).catalog;
  __n = 2;
LAB_0119eb5d:
  pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         *)this_00,__n);
  _Var3._M_head_impl = local_d0._M_head_impl;
  BindContext::CreateColumnReference
            ((BindContext *)local_d0._M_head_impl,table_alias,column_name_00,(ColumnBindType)pvVar4)
  ;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )_Var3._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression> ExpressionBinder::QualifyColumnNameWithManyDotsInternal(ColumnRefExpression &col_ref,
                                                                                     ErrorData &error,
                                                                                     idx_t &struct_extract_start) {
	// two or more dots (i.e. "part1.part2.part3.part4...")
	// -> part1 is a catalog, part2 is a schema, part3 is a table, part4 is a column name, part 5 and beyond are
	// struct fields
	// -> part1 is a catalog, part2 is a table, part3 is a column name, part4 and beyond are struct fields
	// -> part1 is a schema, part2 is a table, part3 is a column name, part4 and beyond are struct fields
	// -> part1 is a table, part2 is a column name, part3 and beyond are struct fields
	// -> part1 is a column, part2 and beyond are struct fields

	// we always prefer the most top-level view
	// i.e. in case of multiple resolution options, we resolve in order:
	// -> 1. resolve "part1" as a catalog
	// -> 2. resolve "part1" as a schema
	// -> 3. resolve "part1" as a table
	// -> 4. resolve "part1" as a column

	// first check if part1 is a catalog
	optional_ptr<Binding> binding;
	if (col_ref.column_names.size() > 3) {
		binding = binder.GetMatchingBinding(col_ref.column_names[0], col_ref.column_names[1], col_ref.column_names[2],
		                                    col_ref.column_names[3], error);
		if (binding) {
			// part1 is a catalog - the column reference is "catalog.schema.table.column"
			struct_extract_start = 4;
			return binder.bind_context.CreateColumnReference(binding->alias, col_ref.column_names[3]);
		}
	}
	binding = binder.GetMatchingBinding(col_ref.column_names[0], INVALID_SCHEMA, col_ref.column_names[1],
	                                    col_ref.column_names[2], error);
	if (binding) {
		// part1 is a catalog - the column reference is "catalog.table.column"
		struct_extract_start = 3;
		return binder.bind_context.CreateColumnReference(binding->alias, col_ref.column_names[2]);
	}
	binding =
	    binder.GetMatchingBinding(col_ref.column_names[0], col_ref.column_names[1], col_ref.column_names[2], error);
	if (binding) {
		// part1 is a schema - the column reference is "schema.table.column"
		// any additional fields are turned into struct_extract calls
		struct_extract_start = 3;
		return binder.bind_context.CreateColumnReference(binding->alias, col_ref.column_names[2]);
	}
	binding = binder.GetMatchingBinding(col_ref.column_names[0], col_ref.column_names[1], error);
	if (binding) {
		// part1 is a table
		// the column reference is "table.column"
		// any additional fields are turned into struct_extract calls
		struct_extract_start = 2;
		return binder.bind_context.CreateColumnReference(binding->alias, col_ref.column_names[1]);
	}
	// part1 could be a column
	ErrorData col_error;
	auto result_expr = QualifyColumnName(col_ref.column_names[0], col_error);
	if (result_expr) {
		// it is! add the struct extract calls
		struct_extract_start = 1;
		return result_expr;
	}
	return CreateStructPack(col_ref);
}